

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator.hpp
# Opt level: O2

void __thiscall helics::Translator::~Translator(Translator *this)

{
  ~Translator(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

Translator(Translator&& trans) = default;